

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::GridRenderCase::genGeometrySource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  ostringstream buf;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  bVar1 = *(byte *)((long)this + 0x80);
  pcVar2 = "vtx_color";
  if (bVar1 != 0) {
    pcVar2 = "tess_color";
  }
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "${GLSL_VERSION_DECL}\n${GEOMETRY_SHADER_REQUIRE}\nlayout(triangles) in;\nlayout(max_vertices=9, triangle_strip) out;\n\nin highp vec4 "
             ,0x81);
  lVar3 = (ulong)bVar1 + 9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,pcVar2,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "[3];\nout highp vec4 geo_color;\nuniform highp vec4 u_posScale;\n\nflat in highp float v_geo_bbox_expansionSize[3];\nflat in highp vec3 v_geo_bbox_clipMin[3];\nflat in highp vec3 v_geo_bbox_clipMax[3];\nflat out highp vec3 v_bbox_clipMin;\nflat out highp vec3 v_bbox_clipMax;\nflat out highp float v_bbox_expansionSize;\n"
             ,0x137);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "vec4 mirrorX(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(2.0 * patternCenter.x - p.x, p.y, p.z, p.w);\n}\n"
             ,0xf1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "\nvoid setVisualizationVaryings()\n{\n\tv_bbox_expansionSize = v_geo_bbox_expansionSize[0];\n\tv_bbox_clipMin = v_geo_bbox_clipMin[0];\n\tv_bbox_clipMax = v_geo_bbox_clipMax[0];\n}\nvoid main()\n{\n\t// Non-trivial geometry shader: 1-to-3 amplification, mirror horizontally\n\thighp vec4 p0 = mirrorX(gl_in[0].gl_Position);\n\thighp vec4 p1 = mirrorX(gl_in[1].gl_Position);\n\thighp vec4 p2 = mirrorX(gl_in[2].gl_Position);\n\thighp vec4 pCentroid = vec4((p0.xyz + p1.xyz + p2.xyz) / 3.0, 1.0);\n\thighp vec4 triangleColor = "
             ,0x1f6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,pcVar2,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "[0];\n\n\tgl_Position = p0; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = p1; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = pCentroid; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tEndPrimitive();\n\n\tgl_Position = p1; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = p2; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = pCentroid; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tEndPrimitive();\n\n\tgl_Position = p2; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = p0; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = pCentroid; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n\tEndPrimitive();\n}\n"
             ,0x36a);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string GridRenderCase::genGeometrySource (void) const
{
	const char* const	colorInputName = (m_hasTessellationStage) ? ("tess_color") : ("vtx_color");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GEOMETRY_SHADER_REQUIRE}\n"
			"layout(triangles) in;\n"
			"layout(max_vertices=9, triangle_strip) out;\n"
			"\n"
			"in highp vec4 " << colorInputName << "[3];\n"
			"out highp vec4 geo_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n"
			"flat in highp float v_geo_bbox_expansionSize[3];\n"
			"flat in highp vec3 v_geo_bbox_clipMin[3];\n"
			"flat in highp vec3 v_geo_bbox_clipMax[3];\n"
			"flat out highp vec3 v_bbox_clipMin;\n"
			"flat out highp vec3 v_bbox_clipMax;\n"
			"flat out highp float v_bbox_expansionSize;\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_X)
		<<	"\n"
			"void setVisualizationVaryings()\n"
			"{\n"
			"	v_bbox_expansionSize = v_geo_bbox_expansionSize[0];\n"
			"	v_bbox_clipMin = v_geo_bbox_clipMin[0];\n"
			"	v_bbox_clipMax = v_geo_bbox_clipMax[0];\n"
			"}\n"
			"void main()\n"
			"{\n"
			"	// Non-trivial geometry shader: 1-to-3 amplification, mirror horizontally\n"
			"	highp vec4 p0 = mirrorX(gl_in[0].gl_Position);\n"
			"	highp vec4 p1 = mirrorX(gl_in[1].gl_Position);\n"
			"	highp vec4 p2 = mirrorX(gl_in[2].gl_Position);\n"
			"	highp vec4 pCentroid = vec4((p0.xyz + p1.xyz + p2.xyz) / 3.0, 1.0);\n"
			"	highp vec4 triangleColor = " << colorInputName << "[0];\n"
			"\n"
			"	gl_Position = p0; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = p1; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = pCentroid; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	EndPrimitive();\n"
			"\n"
			"	gl_Position = p1; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = p2; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = pCentroid; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	EndPrimitive();\n"
			"\n"
			"	gl_Position = p2; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = p0; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = pCentroid; geo_color = triangleColor; setVisualizationVaryings(); EmitVertex();\n"
			"	EndPrimitive();\n"
			"}\n";

	return buf.str();
}